

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.h
# Opt level: O3

void __thiscall TPZKrylovEigenSolver<float>::SetKrylovDim(TPZKrylovEigenSolver<float> *this,int k)

{
  long *plVar1;
  
  if (k < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Adjusted Krylov dim to ",0x17);
    k = 2;
    plVar1 = (long *)std::ostream::operator<<(&std::cout,2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  this->fKrylovDim = k;
  return;
}

Assistant:

void TPZKrylovEigenSolver<TVar>::SetKrylovDim(int k)
{
  if(k<2){
    k = 2;
    std::cout<< "Adjusted Krylov dim to "<< k<<std::endl;
  }
  fKrylovDim = k;
}